

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDeviceUtil.cpp
# Opt level: O3

VkPhysicalDevice
vk::chooseDevice(InstanceInterface *vkInstance,VkInstance instance,CommandLine *cmdLine)

{
  VkPhysicalDevice pVVar1;
  int iVar2;
  InternalError *this;
  pointer_____offset_0x10___ *ppuVar3;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_28;
  
  enumeratePhysicalDevices(&local_28,vkInstance,instance);
  if (local_28.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_28.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this,"No Vulkan devices available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkDeviceUtil.cpp"
               ,0x59);
    ppuVar3 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar2 = tcu::CommandLine::getVKDeviceId(cmdLine);
    if ((0 < iVar2) &&
       (iVar2 < (int)((ulong)((long)local_28.
                                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_28.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1)) {
      iVar2 = tcu::CommandLine::getVKDeviceId(cmdLine);
      pVVar1 = local_28.
               super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar2 + -1];
      operator_delete(local_28.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_28.
                            super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.
                            super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return pVVar1;
    }
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Invalid --deqp-vk-device-id",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkDeviceUtil.cpp"
               ,0x5c);
    ppuVar3 = &tcu::InternalError::typeinfo;
  }
  __cxa_throw(this,ppuVar3,tcu::Exception::~Exception);
}

Assistant:

VkPhysicalDevice chooseDevice (const InstanceInterface& vkInstance, VkInstance instance, const tcu::CommandLine& cmdLine)
{
	const vector<VkPhysicalDevice>	devices	= enumeratePhysicalDevices(vkInstance, instance);

	if (devices.empty())
		TCU_THROW(NotSupportedError, "No Vulkan devices available");

	if (!de::inBounds(cmdLine.getVKDeviceId(), 1, (int)devices.size()+1))
		TCU_THROW(InternalError, "Invalid --deqp-vk-device-id");

	return devices[(size_t)(cmdLine.getVKDeviceId()-1)];
}